

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool __thiscall ON_MeshTopology::TopVertexIsHidden(ON_MeshTopology *this,int topvi)

{
  ON_Mesh *pOVar1;
  bool *pbVar2;
  ON_MeshTopologyVertex *pOVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  
  pOVar1 = this->m_mesh;
  if (((pOVar1 != (ON_Mesh *)0x0) && (0 < pOVar1->m_hidden_count)) &&
     ((pOVar1->m_H).m_count == (pOVar1->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count)) {
    bVar4 = false;
    if (((-1 < topvi) && (pbVar2 = (pOVar1->m_H).m_a, pbVar2 != (bool *)0x0)) &&
       (topvi < (this->m_topv).m_count)) {
      pOVar3 = (this->m_topv).m_a;
      lVar5 = (long)pOVar3[(uint)topvi].m_v_count;
      if (lVar5 < 1) {
        return true;
      }
      lVar6 = 0;
      do {
        bVar4 = pbVar2[pOVar3[(uint)topvi].m_vi[lVar6]];
        if (bVar4 != true) {
          return bVar4;
        }
        bVar7 = lVar5 + -1 != lVar6;
        bVar4 = true;
        lVar6 = lVar6 + 1;
      } while (bVar7);
    }
    return bVar4;
  }
  return false;
}

Assistant:

bool ON_MeshTopology::TopVertexIsHidden( int topvi ) const
{
  const bool* bHiddenVertex = m_mesh ? m_mesh->HiddenVertexArray() : 0;
  if ( bHiddenVertex && topvi >= 0 && topvi < m_topv.Count() )
  {
    const ON_MeshTopologyVertex& topv = m_topv[topvi];
    int i;
    for ( i = 0; i < topv.m_v_count; i++ )
    {
      if ( !bHiddenVertex[topv.m_vi[i]] )
        return false;
    }
    return true;
  }
  return false;
}